

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
::Set_column(Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
             *this,Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
                   *column)

{
  Z2_field_operators *pZVar1;
  New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_>
  *pNVar2;
  void *local_28;
  void *local_20;
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
  *local_18;
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
  *column_local;
  Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
  *this_local;
  
  local_18 = column;
  column_local = this;
  Row_access<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
  ::Row_access(&this->super_Row_access_option,&column->super_Row_access_option);
  Column_dimension_holder<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
  ::Column_dimension_holder
            (&this->super_Column_dimension_option,&local_18->super_Column_dimension_option);
  Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
  ::Chain_column_extra_properties
            (&this->super_Chain_column_option,&local_18->super_Chain_column_option);
  std::
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>_*>_>
  ::set(&this->column_,&local_18->column_);
  local_20 = (void *)0x0;
  pZVar1 = std::exchange<Gudhi::persistence_fields::Z2_field_operators*,decltype(nullptr)>
                     (&local_18->operators_,&local_20);
  this->operators_ = pZVar1;
  local_28 = (void *)0x0;
  pNVar2 = std::
           exchange<Gudhi::persistence_matrix::New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,false>>>>*,decltype(nullptr)>
                     (&local_18->entryPool_,&local_28);
  this->entryPool_ = pNVar2;
  return;
}

Assistant:

inline Set_column<Master_matrix>::Set_column(Set_column&& column) noexcept
    : RA_opt(std::move(static_cast<RA_opt&>(column))),
      Dim_opt(std::move(static_cast<Dim_opt&>(column))),
      Chain_opt(std::move(static_cast<Chain_opt&>(column))),
      column_(std::move(column.column_)),
      operators_(std::exchange(column.operators_, nullptr)),
      entryPool_(std::exchange(column.entryPool_, nullptr))
{}